

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_tst_htmlmodelserialiser.cpp
# Opt level: O2

void tst_HtmlModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      autoParent((tst_HtmlModelSerialiser *)_o);
      return;
    case 1:
      initTestCase((tst_HtmlModelSerialiser *)_o);
      return;
    case 2:
      basicSaveLoadByteArray((tst_HtmlModelSerialiser *)_o);
      return;
    case 3:
      basicSaveLoadFile((tst_HtmlModelSerialiser *)_o);
      return;
    case 4:
      basicSaveLoadString((tst_HtmlModelSerialiser *)_o);
      return;
    case 5:
      basicSaveLoadNested((tst_HtmlModelSerialiser *)_o);
      return;
    case 6:
    case 7:
    case 8:
    case 9:
      (*(code *)**(undefined8 **)(_o + 0x10))
                (_o + 0x10,_o,&switchD_00106c69::switchdataD_0010f010,
                 (code *)**(undefined8 **)(_o + 0x10));
      return;
    case 10:
      validateHtmlOutput((tst_HtmlModelSerialiser *)_o);
      return;
    case 0xb:
      validateHtmlOutput_data((tst_HtmlModelSerialiser *)_o);
      return;
    }
  }
  return;
}

Assistant:

void tst_HtmlModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<tst_HtmlModelSerialiser *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->autoParent(); break;
        case 1: _t->initTestCase(); break;
        case 2: _t->basicSaveLoadByteArray(); break;
        case 3: _t->basicSaveLoadFile(); break;
        case 4: _t->basicSaveLoadString(); break;
        case 5: _t->basicSaveLoadNested(); break;
        case 6: _t->basicSaveLoadByteArray_data(); break;
        case 7: _t->basicSaveLoadFile_data(); break;
        case 8: _t->basicSaveLoadString_data(); break;
        case 9: _t->basicSaveLoadNested_data(); break;
        case 10: _t->validateHtmlOutput(); break;
        case 11: _t->validateHtmlOutput_data(); break;
        default: ;
        }
    }
    (void)_a;
}